

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O2

UStringTrieResult __thiscall
icu_63::BytesTrie::nextImpl(BytesTrie *this,uint8_t *pos,int32_t inByte)

{
  byte bVar1;
  UStringTrieResult UVar2;
  byte *pbVar3;
  
  while( true ) {
    pbVar3 = pos;
    bVar1 = *pbVar3;
    if (bVar1 < 0x10) {
      UVar2 = branchNext(this,pbVar3 + 1,(uint)bVar1,inByte);
      return UVar2;
    }
    if (bVar1 < 0x20) break;
    if ((bVar1 & 1) != 0) goto LAB_002cfc24;
    pos = pbVar3 + 1;
    if (0xa1 < bVar1) {
      if (bVar1 < 0xd8) {
        pos = pbVar3 + 2;
      }
      else if (bVar1 < 0xfc) {
        pos = pbVar3 + 3;
      }
      else {
        pos = pbVar3 + (ulong)((bVar1 >> 1 & 1) != 0) + 4;
      }
    }
  }
  if ((uint)pbVar3[1] == inByte) {
    this->remainingMatchLength_ = bVar1 - 0x11;
    this->pos_ = pbVar3 + 2;
    if (bVar1 != 0x10) {
      return USTRINGTRIE_NO_VALUE;
    }
    UVar2 = (UStringTrieResult)pbVar3[2];
    if (UVar2 < 0x20) {
      return USTRINGTRIE_NO_VALUE;
    }
    return UVar2 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
  }
LAB_002cfc24:
  this->pos_ = (uint8_t *)0x0;
  return USTRINGTRIE_NO_MATCH;
}

Assistant:

UStringTrieResult
BytesTrie::nextImpl(const uint8_t *pos, int32_t inByte) {
    for(;;) {
        int32_t node=*pos++;
        if(node<kMinLinearMatch) {
            return branchNext(pos, node, inByte);
        } else if(node<kMinValueLead) {
            // Match the first of length+1 bytes.
            int32_t length=node-kMinLinearMatch;  // Actual match length minus 1.
            if(inByte==*pos++) {
                remainingMatchLength_=--length;
                pos_=pos;
                return (length<0 && (node=*pos)>=kMinValueLead) ?
                        valueResult(node) : USTRINGTRIE_NO_VALUE;
            } else {
                // No match.
                break;
            }
        } else if(node&kValueIsFinal) {
            // No further matching bytes.
            break;
        } else {
            // Skip intermediate value.
            pos=skipValue(pos, node);
            // The next node must not also be a value node.
            U_ASSERT(*pos<kMinValueLead);
        }
    }
    stop();
    return USTRINGTRIE_NO_MATCH;
}